

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

int on_strnicmp(char *s1,char *s2,int n)

{
  int iVar1;
  int n_local;
  char *s2_local;
  char *s1_local;
  
  iVar1 = strncasecmp(s1,s2,(long)n);
  return iVar1;
}

Assistant:

int on_strnicmp(const char * s1, const char * s2, int n)
{
#if defined(ON_RUNTIME_WIN)
  //return stricmp(s1,s2,n);
  return _strnicmp(s1,s2,n);
#else
  return strncasecmp(s1,s2,n);
#endif
}